

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_1,_true,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  Geometry *pGVar22;
  RTCIntersectArguments *pRVar23;
  RTCRayQueryContext *pRVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined1 (*pauVar32) [16];
  int iVar33;
  undefined4 uVar34;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar35;
  ulong uVar36;
  Scene *pSVar37;
  undefined4 uVar38;
  undefined1 in_R8 [8];
  ulong uVar39;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  uint *puVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  float fVar58;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar98;
  float fVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar99;
  float fVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar107;
  float fVar108;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar113;
  float fVar114;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar128;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar146;
  float fVar147;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_136c;
  float fStack_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  RayQueryContext *local_1340;
  undefined1 local_1338 [16];
  undefined1 local_1328 [8];
  float fStack_1320;
  float fStack_131c;
  undefined1 local_1318 [8];
  float fStack_1310;
  float fStack_130c;
  RTCFilterFunctionNArguments local_1308;
  long local_12d8;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float local_12c4;
  float local_12c0;
  float local_12bc;
  float local_12b8;
  undefined4 local_12b4;
  uint local_12b0;
  uint local_12ac;
  uint local_12a8;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  undefined8 local_1288;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  undefined1 local_1248 [16];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined1 local_1208 [16];
  float local_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  float local_11e8;
  uint uStack_11e4;
  uint uStack_11e0;
  uint uStack_11dc;
  float local_11d8 [4];
  float local_11c8 [4];
  float local_11b8 [4];
  float local_11a8 [4];
  undefined1 local_1198 [16];
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined8 local_1168;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 local_1128;
  float fStack_1120;
  float fStack_111c;
  ulong local_1118;
  ulong local_1110;
  undefined1 (*local_1108) [16];
  Scene *local_1100;
  long local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  long local_10d0;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1108 = (undefined1 (*) [16])local_f68;
      fVar113 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar121 = 0.0;
      if (0.0 <= fVar113) {
        fVar121 = fVar113;
      }
      aVar13 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar113 = (ray->super_RayK<1>).tfar;
      fVar127 = 0.0;
      if (0.0 <= fVar113) {
        fVar127 = fVar113;
      }
      uVar45 = -(uint)(1e-18 <= ABS(aVar13.x));
      uVar47 = -(uint)(1e-18 <= ABS(aVar13.y));
      uVar51 = -(uint)(1e-18 <= ABS(aVar13.z));
      local_1088 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1098 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1068 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar73 = divps(_DAT_01feca10,(undefined1  [16])aVar13);
      local_10c8 = (float)(~uVar45 & 0x5d5e0b6b | auVar73._0_4_ & uVar45);
      local_1188 = (float)(~uVar47 & 0x5d5e0b6b | auVar73._4_4_ & uVar47);
      local_1058 = (float)(~uVar51 & 0x5d5e0b6b | auVar73._8_4_ & uVar51);
      local_10a8 = local_10c8 * 0.99999964;
      local_10b8 = local_1188 * 0.99999964;
      local_1078 = local_1058 * 0.99999964;
      local_10c8 = local_10c8 * 1.0000004;
      local_1188 = local_1188 * 1.0000004;
      local_1058 = local_1058 * 1.0000004;
      local_1110 = (ulong)(local_10a8 < 0.0) << 4;
      local_1118 = (ulong)(local_10b8 < 0.0) << 4 | 0x20;
      local_10d8 = (ulong)(local_1078 < 0.0) << 4 | 0x40;
      local_10e0 = local_1110 ^ 0x10;
      local_10e8 = local_1118 ^ 0x10;
      local_10f0 = local_10d8 ^ 0x10;
      local_1048._4_4_ = fVar121;
      local_1048._0_4_ = fVar121;
      local_1048._8_4_ = fVar121;
      local_1048._12_4_ = fVar121;
      auVar116._4_4_ = fVar127;
      auVar116._0_4_ = fVar127;
      auVar116._8_4_ = fVar127;
      auVar116._12_4_ = fVar127;
      auVar73._8_4_ = 0xffffffff;
      auVar73._0_8_ = 0xffffffffffffffff;
      auVar73._12_4_ = 0xffffffff;
      local_1008 = mm_lookupmask_ps._0_16_;
      local_1038 = mm_lookupmask_ps._0_16_ ^ auVar73;
      local_1018 = mm_lookupmask_ps._240_16_;
      local_1028 = auVar73 ^ mm_lookupmask_ps._240_16_;
      local_1340 = context;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1074 = local_1078;
      fStack_1070 = local_1078;
      fStack_106c = local_1078;
      fStack_1084 = local_1088;
      fStack_1080 = local_1088;
      fStack_107c = local_1088;
      fStack_1094 = local_1098;
      fStack_1090 = local_1098;
      fStack_108c = local_1098;
      fStack_10a4 = local_10a8;
      fStack_10a0 = local_10a8;
      fStack_109c = local_10a8;
      fStack_10b4 = local_10b8;
      fStack_10b0 = local_10b8;
      fStack_10ac = local_10b8;
      fStack_10c4 = local_10c8;
      fStack_10c0 = local_10c8;
      fStack_10bc = local_10c8;
      fStack_1184 = local_1188;
      fStack_1180 = local_1188;
      fStack_117c = local_1188;
      uVar36 = local_1110;
      uVar43 = local_1118;
      auVar73 = local_1048;
      fVar113 = local_1098;
      fVar121 = local_1098;
      fVar127 = local_1098;
      fVar147 = local_1098;
      fVar58 = local_10a8;
      fVar65 = local_10a8;
      fVar66 = local_10a8;
      fVar67 = local_10a8;
      fVar88 = local_1188;
      fVar98 = local_1188;
      fVar100 = local_1188;
      fVar101 = local_1188;
      fVar108 = local_10b8;
      fVar89 = local_10b8;
      fVar99 = local_10b8;
      fVar102 = local_10b8;
      fVar105 = local_10c8;
      fVar106 = local_10c8;
      fVar107 = local_10c8;
      fVar111 = local_10c8;
      fVar112 = local_1058;
      fVar114 = local_1058;
      fVar119 = local_1058;
      fVar120 = local_1058;
      fVar122 = local_1068;
      fVar125 = local_1068;
      fVar126 = local_1068;
      fVar128 = local_1068;
      fVar131 = local_1078;
      fVar132 = local_1078;
      fVar133 = local_1078;
      fVar134 = local_1078;
      fVar135 = local_1088;
      fVar136 = local_1088;
      fVar137 = local_1088;
      fVar138 = local_1088;
      do {
        do {
          do {
            if (local_1108 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar32 = local_1108 + -1;
            local_1108 = local_1108 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar32 + 8));
          uVar42 = *(ulong *)*local_1108;
          do {
            if ((uVar42 & 8) == 0) {
              pfVar12 = (float *)(uVar42 + 0x20 + uVar36);
              auVar68._0_4_ = (*pfVar12 - fVar135) * fVar58;
              auVar68._4_4_ = (pfVar12[1] - fVar136) * fVar65;
              auVar68._8_4_ = (pfVar12[2] - fVar137) * fVar66;
              auVar68._12_4_ = (pfVar12[3] - fVar138) * fVar67;
              pfVar12 = (float *)(uVar42 + 0x20 + uVar43);
              auVar93._0_4_ = (*pfVar12 - fVar113) * fVar108;
              auVar93._4_4_ = (pfVar12[1] - fVar121) * fVar89;
              auVar93._8_4_ = (pfVar12[2] - fVar127) * fVar99;
              auVar93._12_4_ = (pfVar12[3] - fVar147) * fVar102;
              auVar68 = maxps(auVar68,auVar93);
              pfVar12 = (float *)(uVar42 + 0x20 + local_10d8);
              auVar104._0_4_ = (*pfVar12 - fVar122) * fVar131;
              auVar104._4_4_ = (pfVar12[1] - fVar125) * fVar132;
              auVar104._8_4_ = (pfVar12[2] - fVar126) * fVar133;
              auVar104._12_4_ = (pfVar12[3] - fVar128) * fVar134;
              auVar74 = maxps(auVar104,auVar73);
              _local_1268 = maxps(auVar68,auVar74);
              pfVar12 = (float *)(uVar42 + 0x20 + local_10e0);
              auVar110._0_4_ = (*pfVar12 - fVar135) * fVar105;
              auVar110._4_4_ = (pfVar12[1] - fVar136) * fVar106;
              auVar110._8_4_ = (pfVar12[2] - fVar137) * fVar107;
              auVar110._12_4_ = (pfVar12[3] - fVar138) * fVar111;
              pfVar12 = (float *)(uVar42 + 0x20 + local_10e8);
              auVar81._0_4_ = (*pfVar12 - fVar113) * fVar88;
              auVar81._4_4_ = (pfVar12[1] - fVar121) * fVar98;
              auVar81._8_4_ = (pfVar12[2] - fVar127) * fVar100;
              auVar81._12_4_ = (pfVar12[3] - fVar147) * fVar101;
              auVar68 = minps(auVar110,auVar81);
              pfVar12 = (float *)(uVar42 + 0x20 + local_10f0);
              auVar82._0_4_ = (*pfVar12 - fVar122) * fVar112;
              auVar82._4_4_ = (pfVar12[1] - fVar125) * fVar114;
              auVar82._8_4_ = (pfVar12[2] - fVar126) * fVar119;
              auVar82._12_4_ = (pfVar12[3] - fVar128) * fVar120;
              auVar74 = minps(auVar82,auVar116);
              auVar68 = minps(auVar68,auVar74);
              auVar74._4_4_ = -(uint)(local_1268._4_4_ <= auVar68._4_4_);
              auVar74._0_4_ = -(uint)(local_1268._0_4_ <= auVar68._0_4_);
              auVar74._8_4_ = -(uint)(local_1268._8_4_ <= auVar68._8_4_);
              auVar74._12_4_ = -(uint)(local_1268._12_4_ <= auVar68._12_4_);
              uVar38 = movmskps(SUB84(in_R8,0),auVar74);
              in_R8 = (undefined1  [8])CONCAT44((int)((ulong)in_R8 >> 0x20),uVar38);
            }
            if ((uVar42 & 8) == 0) {
              if (in_R8 == (undefined1  [8])0x0) {
                iVar33 = 4;
              }
              else {
                uVar41 = uVar42 & 0xfffffffffffffff0;
                lVar25 = 0;
                if (in_R8 != (undefined1  [8])0x0) {
                  for (; ((ulong)in_R8 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                iVar33 = 0;
                uVar42 = *(ulong *)(uVar41 + lVar25 * 8);
                uVar39 = (long)in_R8 - 1U & (ulong)in_R8;
                if (uVar39 != 0) {
                  uVar45 = *(uint *)(local_1268 + lVar25 * 4);
                  lVar25 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                    }
                  }
                  uVar16 = *(ulong *)(uVar41 + lVar25 * 8);
                  uVar47 = *(uint *)(local_1268 + lVar25 * 4);
                  uVar39 = uVar39 - 1 & uVar39;
                  if (uVar39 == 0) {
                    if (uVar45 < uVar47) {
                      *(ulong *)*local_1108 = uVar16;
                      *(uint *)((long)*local_1108 + 8) = uVar47;
                      local_1108 = local_1108 + 1;
                    }
                    else {
                      *(ulong *)*local_1108 = uVar42;
                      *(uint *)((long)*local_1108 + 8) = uVar45;
                      local_1108 = local_1108 + 1;
                      uVar42 = uVar16;
                    }
                  }
                  else {
                    auVar69._8_4_ = uVar45;
                    auVar69._0_8_ = uVar42;
                    auVar69._12_4_ = 0;
                    auVar75._8_4_ = uVar47;
                    auVar75._0_8_ = uVar16;
                    auVar75._12_4_ = 0;
                    lVar25 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                      }
                    }
                    uVar42 = *(ulong *)(uVar41 + lVar25 * 8);
                    iVar14 = *(int *)(local_1268 + lVar25 * 4);
                    auVar83._8_4_ = iVar14;
                    auVar83._0_8_ = uVar42;
                    auVar83._12_4_ = 0;
                    auVar90._8_4_ = -(uint)((int)uVar45 < (int)uVar47);
                    uVar39 = uVar39 - 1 & uVar39;
                    fVar88 = local_1188;
                    fVar98 = fStack_1184;
                    fVar100 = fStack_1180;
                    fVar101 = fStack_117c;
                    if (uVar39 == 0) {
                      auVar90._4_4_ = auVar90._8_4_;
                      auVar90._0_4_ = auVar90._8_4_;
                      auVar90._12_4_ = auVar90._8_4_;
                      auVar68 = auVar69 & auVar90 | ~auVar90 & auVar75;
                      auVar74 = auVar75 & auVar90 | ~auVar90 & auVar69;
                      auVar91._8_4_ = -(uint)(auVar68._8_4_ < iVar14);
                      auVar91._0_8_ = CONCAT44(auVar91._8_4_,auVar91._8_4_);
                      auVar91._12_4_ = auVar91._8_4_;
                      uVar42 = ~auVar91._0_8_ & uVar42 | auVar68._0_8_ & auVar91._0_8_;
                      auVar68 = auVar83 & auVar91 | ~auVar91 & auVar68;
                      auVar70._8_4_ = -(uint)(auVar74._8_4_ < auVar68._8_4_);
                      auVar70._4_4_ = auVar70._8_4_;
                      auVar70._0_4_ = auVar70._8_4_;
                      auVar70._12_4_ = auVar70._8_4_;
                      *local_1108 = ~auVar70 & auVar74 | auVar68 & auVar70;
                      local_1108[1] = auVar74 & auVar70 | ~auVar70 & auVar68;
                      local_1108 = local_1108 + 2;
                    }
                    else {
                      lVar25 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                        }
                      }
                      iVar15 = *(int *)(local_1268 + lVar25 * 4);
                      auVar103._8_4_ = iVar15;
                      auVar103._0_8_ = *(undefined8 *)(uVar41 + lVar25 * 8);
                      auVar103._12_4_ = 0;
                      auVar92._4_4_ = auVar90._8_4_;
                      auVar92._0_4_ = auVar90._8_4_;
                      auVar92._8_4_ = auVar90._8_4_;
                      auVar92._12_4_ = auVar90._8_4_;
                      auVar68 = auVar69 & auVar92 | ~auVar92 & auVar75;
                      auVar74 = auVar75 & auVar92 | ~auVar92 & auVar69;
                      auVar109._0_4_ = -(uint)(iVar14 < iVar15);
                      auVar109._4_4_ = -(uint)(iVar14 < iVar15);
                      auVar109._8_4_ = -(uint)(iVar14 < iVar15);
                      auVar109._12_4_ = -(uint)(iVar14 < iVar15);
                      auVar93 = auVar83 & auVar109 | ~auVar109 & auVar103;
                      auVar110 = ~auVar109 & auVar83 | auVar103 & auVar109;
                      auVar84._8_4_ = -(uint)(auVar74._8_4_ < auVar110._8_4_);
                      auVar84._4_4_ = auVar84._8_4_;
                      auVar84._0_4_ = auVar84._8_4_;
                      auVar84._12_4_ = auVar84._8_4_;
                      auVar104 = auVar74 & auVar84 | ~auVar84 & auVar110;
                      auVar76._8_4_ = -(uint)(auVar68._8_4_ < auVar93._8_4_);
                      auVar76._0_8_ = CONCAT44(auVar76._8_4_,auVar76._8_4_);
                      auVar76._12_4_ = auVar76._8_4_;
                      uVar42 = auVar68._0_8_ & auVar76._0_8_ | ~auVar76._0_8_ & auVar93._0_8_;
                      auVar68 = ~auVar76 & auVar68 | auVar93 & auVar76;
                      auVar71._8_4_ = -(uint)(auVar68._8_4_ < auVar104._8_4_);
                      auVar71._4_4_ = auVar71._8_4_;
                      auVar71._0_4_ = auVar71._8_4_;
                      auVar71._12_4_ = auVar71._8_4_;
                      *local_1108 = ~auVar84 & auVar74 | auVar110 & auVar84;
                      local_1108[1] = ~auVar71 & auVar68 | auVar104 & auVar71;
                      local_1108[2] = auVar68 & auVar71 | ~auVar71 & auVar104;
                      local_1108 = local_1108 + 3;
                      fVar108 = local_10b8;
                      fVar89 = fStack_10b4;
                      fVar99 = fStack_10b0;
                      fVar102 = fStack_10ac;
                      fVar105 = local_10c8;
                      fVar106 = fStack_10c4;
                      fVar107 = fStack_10c0;
                      fVar111 = fStack_10bc;
                    }
                  }
                }
              }
            }
            else {
              iVar33 = 6;
            }
          } while (iVar33 == 0);
        } while (iVar33 != 6);
        local_10f8 = (ulong)((uint)uVar42 & 0xf) - 8;
        if (local_10f8 != 0) {
          local_10d0 = 0;
          do {
            pSVar37 = context->scene;
            puVar1 = (uint *)(local_10d0 * 0x60 + (uVar42 & 0xfffffffffffffff0));
            puVar44 = puVar1 + 0x10;
            ppfVar17 = (pSVar37->vertices).items;
            pfVar18 = ppfVar17[*puVar44];
            pfVar12 = pfVar18 + *puVar1;
            pfVar2 = pfVar18 + puVar1[4];
            pfVar3 = pfVar18 + puVar1[8];
            pfVar18 = pfVar18 + puVar1[0xc];
            pfVar19 = ppfVar17[puVar1[0x11]];
            pfVar4 = pfVar19 + puVar1[1];
            pfVar5 = pfVar19 + puVar1[5];
            pfVar6 = pfVar19 + puVar1[9];
            pfVar19 = pfVar19 + puVar1[0xd];
            pfVar20 = ppfVar17[puVar1[0x12]];
            pfVar7 = pfVar20 + puVar1[2];
            pfVar8 = pfVar20 + puVar1[6];
            uVar31 = *(undefined8 *)(pfVar20 + puVar1[0xe]);
            pfVar21 = ppfVar17[puVar1[0x13]];
            pfVar9 = pfVar21 + puVar1[3];
            pfVar10 = pfVar21 + puVar1[7];
            pfVar11 = pfVar21 + puVar1[0xf];
            local_1318._4_4_ = (undefined4)((ulong)*(undefined8 *)(pfVar20 + puVar1[10]) >> 0x20);
            local_1288 = (Scene *)CONCAT44(pfVar6[2],pfVar3[2]);
            local_1128 = CONCAT44(*pfVar6,*pfVar3);
            local_1118 = CONCAT44(pfVar21[puVar1[0xb]],(int)*(undefined8 *)(pfVar20 + puVar1[10]));
            local_1138 = pfVar3[1];
            fStack_1134 = pfVar6[1];
            fStack_1130 = (float)local_1318._4_4_;
            fStack_112c = (pfVar21 + puVar1[0xb])[1];
            local_1358 = (float)uVar31;
            fStack_1354 = (float)((ulong)uVar31 >> 0x20);
            fStack_1350 = (float)*(undefined8 *)(pfVar20 + puVar1[0xe] + 2);
            fVar113 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar121 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar127 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_1298 = *pfVar12 - fVar113;
            fStack_1294 = *pfVar4 - fVar113;
            fStack_1290 = *pfVar7 - fVar113;
            fStack_128c = *pfVar9 - fVar113;
            fVar142 = *pfVar2 - fVar113;
            fVar146 = *pfVar5 - fVar113;
            fStack_12d0 = *pfVar8 - fVar113;
            fStack_12cc = *pfVar10 - fVar113;
            local_1168 = CONCAT44(*pfVar19,*pfVar18);
            local_1158 = local_1358;
            fStack_1154 = *pfVar11;
            fVar108 = *pfVar18 - fVar113;
            fVar111 = *pfVar19 - fVar113;
            fVar112 = local_1358 - fVar113;
            fVar113 = *pfVar11 - fVar113;
            local_f98 = pfVar12[1] - fVar121;
            fStack_f94 = pfVar4[1] - fVar121;
            fStack_f90 = pfVar7[1] - fVar121;
            fStack_f8c = pfVar9[1] - fVar121;
            local_1148 = pfVar2[1];
            fStack_1144 = pfVar5[1];
            fStack_1140 = pfVar8[1];
            fStack_113c = pfVar10[1];
            fVar148 = pfVar2[1] - fVar121;
            fVar150 = pfVar5[1] - fVar121;
            fVar152 = pfVar8[1] - fVar121;
            fVar154 = pfVar10[1] - fVar121;
            local_1318._4_4_ = pfVar19[1];
            local_1318._0_4_ = pfVar18[1];
            fStack_1310 = fStack_1354;
            fStack_130c = pfVar11[1];
            fVar114 = pfVar18[1] - fVar121;
            fVar119 = pfVar19[1] - fVar121;
            fVar120 = fStack_1354 - fVar121;
            fVar121 = pfVar11[1] - fVar121;
            local_f88 = pfVar12[2] - fVar127;
            fStack_f84 = pfVar4[2] - fVar127;
            fStack_f80 = pfVar7[2] - fVar127;
            fStack_f7c = pfVar9[2] - fVar127;
            local_1278 = CONCAT44(pfVar5[2],pfVar2[2]);
            local_1268._4_4_ = pfVar10[2];
            local_1268._0_4_ = pfVar8[2];
            fVar88 = pfVar2[2] - fVar127;
            fVar98 = pfVar5[2] - fVar127;
            fVar100 = pfVar8[2] - fVar127;
            fVar101 = pfVar10[2] - fVar127;
            local_1358 = pfVar18[2];
            fStack_1354 = pfVar19[2];
            fStack_134c = pfVar11[2];
            fVar122 = pfVar18[2] - fVar127;
            fVar125 = pfVar19[2] - fVar127;
            fVar126 = fStack_1350 - fVar127;
            fVar127 = pfVar11[2] - fVar127;
            local_fb8 = fVar114 - local_f98;
            fStack_fb4 = fVar119 - fStack_f94;
            fStack_fb0 = fVar120 - fStack_f90;
            fStack_fac = fVar121 - fStack_f8c;
            local_fa8 = fVar122 - local_f88;
            fStack_fa4 = fVar125 - fStack_f84;
            fStack_fa0 = fVar126 - fStack_f80;
            fStack_f9c = fVar127 - fStack_f7c;
            fVar134 = fVar108 - local_1298;
            fVar136 = fVar111 - fStack_1294;
            fVar138 = fVar112 - fStack_1290;
            fVar140 = fVar113 - fStack_128c;
            local_1178 = fVar134;
            fStack_1174 = fVar136;
            fStack_1170 = fVar138;
            fStack_116c = fVar140;
            fVar147 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_136c.m128[1] = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_1328._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar89 = (local_fb8 * (fVar122 + local_f88) - local_fa8 * (fVar114 + local_f98)) *
                     fVar147 + (local_fa8 * (fVar108 + local_1298) - (fVar122 + local_f88) * fVar134
                               ) * local_136c.m128[1] +
                               ((fVar114 + local_f98) * fVar134 - (fVar108 + local_1298) * local_fb8
                               ) * (float)local_1328._4_4_;
            fVar99 = (fStack_fb4 * (fVar125 + fStack_f84) - fStack_fa4 * (fVar119 + fStack_f94)) *
                     fVar147 + (fStack_fa4 * (fVar111 + fStack_1294) -
                               (fVar125 + fStack_f84) * fVar136) * local_136c.m128[1] +
                               ((fVar119 + fStack_f94) * fVar136 -
                               (fVar111 + fStack_1294) * fStack_fb4) * (float)local_1328._4_4_;
            local_fd8._0_8_ = CONCAT44(fVar99,fVar89);
            local_fd8._8_4_ =
                 (fStack_fb0 * (fVar126 + fStack_f80) - fStack_fa0 * (fVar120 + fStack_f90)) *
                 fVar147 + (fStack_fa0 * (fVar112 + fStack_1290) - (fVar126 + fStack_f80) * fVar138)
                           * local_136c.m128[1] +
                           ((fVar120 + fStack_f90) * fVar138 - (fVar112 + fStack_1290) * fStack_fb0)
                           * (float)local_1328._4_4_;
            local_fd8._12_4_ =
                 (fStack_fac * (fVar127 + fStack_f7c) - fStack_f9c * (fVar121 + fStack_f8c)) *
                 fVar147 + (fStack_f9c * (fVar113 + fStack_128c) - (fVar127 + fStack_f7c) * fVar140)
                           * local_136c.m128[1] +
                           ((fVar121 + fStack_f8c) * fVar140 - (fVar113 + fStack_128c) * fStack_fac)
                           * (float)local_1328._4_4_;
            fVar102 = local_f98 - fVar148;
            fVar105 = fStack_f94 - fVar150;
            fVar106 = fStack_f90 - fVar152;
            fVar107 = fStack_f8c - fVar154;
            local_fc8 = local_f88 - fVar88;
            fStack_fc4 = fStack_f84 - fVar98;
            fStack_fc0 = fStack_f80 - fVar100;
            fStack_fbc = fStack_f7c - fVar101;
            fVar135 = local_1298 - fVar142;
            fVar137 = fStack_1294 - fVar146;
            fVar139 = fStack_1290 - fStack_12d0;
            fVar141 = fStack_128c - fStack_12cc;
            local_1258._0_4_ =
                 (fVar102 * (local_f88 + fVar88) - local_fc8 * (local_f98 + fVar148)) * fVar147 +
                 (local_fc8 * (local_1298 + fVar142) - (local_f88 + fVar88) * fVar135) *
                 local_136c.m128[1] +
                 ((local_f98 + fVar148) * fVar135 - (local_1298 + fVar142) * fVar102) *
                 (float)local_1328._4_4_;
            local_1258._4_4_ =
                 (fVar105 * (fStack_f84 + fVar98) - fStack_fc4 * (fStack_f94 + fVar150)) * fVar147 +
                 (fStack_fc4 * (fStack_1294 + fVar146) - (fStack_f84 + fVar98) * fVar137) *
                 local_136c.m128[1] +
                 ((fStack_f94 + fVar150) * fVar137 - (fStack_1294 + fVar146) * fVar105) *
                 (float)local_1328._4_4_;
            fStack_1250 = (fVar106 * (fStack_f80 + fVar100) - fStack_fc0 * (fStack_f90 + fVar152)) *
                          fVar147 + (fStack_fc0 * (fStack_1290 + fStack_12d0) -
                                    (fStack_f80 + fVar100) * fVar139) * local_136c.m128[1] +
                                    ((fStack_f90 + fVar152) * fVar139 -
                                    (fStack_1290 + fStack_12d0) * fVar106) * (float)local_1328._4_4_
            ;
            fStack_124c = (fVar107 * (fStack_f7c + fVar101) - fStack_fbc * (fStack_f8c + fVar154)) *
                          fVar147 + (fStack_fbc * (fStack_128c + fStack_12cc) -
                                    (fStack_f7c + fVar101) * fVar141) * local_136c.m128[1] +
                                    ((fStack_f8c + fVar154) * fVar141 -
                                    (fStack_128c + fStack_12cc) * fVar107) * (float)local_1328._4_4_
            ;
            fVar58 = fVar142 - fVar108;
            fVar65 = fVar146 - fVar111;
            fVar66 = fStack_12d0 - fVar112;
            fVar67 = fStack_12cc - fVar113;
            fVar149 = fVar148 - fVar114;
            fVar151 = fVar150 - fVar119;
            fVar153 = fVar152 - fVar120;
            fVar155 = fVar154 - fVar121;
            fVar128 = fVar88 - fVar122;
            fVar131 = fVar98 - fVar125;
            fVar132 = fVar100 - fVar126;
            fVar133 = fVar101 - fVar127;
            local_1328._0_4_ = local_1328._4_4_;
            fStack_1320 = (float)local_1328._4_4_;
            fStack_131c = (float)local_1328._4_4_;
            local_136c.m128[2] = local_136c.m128[1];
            local_136c.m128[3] = local_136c.m128[1];
            fStack_135c = local_136c.m128[1];
            auVar72._0_4_ =
                 (fVar149 * (fVar122 + fVar88) - fVar128 * (fVar114 + fVar148)) * fVar147 +
                 (fVar128 * (fVar108 + fVar142) - (fVar122 + fVar88) * fVar58) * local_136c.m128[1]
                 + ((fVar114 + fVar148) * fVar58 - (fVar108 + fVar142) * fVar149) *
                   (float)local_1328._4_4_;
            auVar72._4_4_ =
                 (fVar151 * (fVar125 + fVar98) - fVar131 * (fVar119 + fVar150)) * fVar147 +
                 (fVar131 * (fVar111 + fVar146) - (fVar125 + fVar98) * fVar65) * local_136c.m128[1]
                 + ((fVar119 + fVar150) * fVar65 - (fVar111 + fVar146) * fVar151) *
                   (float)local_1328._4_4_;
            auVar72._8_4_ =
                 (fVar153 * (fVar126 + fVar100) - fVar132 * (fVar120 + fVar152)) * fVar147 +
                 (fVar132 * (fVar112 + fStack_12d0) - (fVar126 + fVar100) * fVar66) *
                 local_136c.m128[1] +
                 ((fVar120 + fVar152) * fVar66 - (fVar112 + fStack_12d0) * fVar153) *
                 (float)local_1328._4_4_;
            auVar72._12_4_ =
                 (fVar155 * (fVar127 + fVar101) - fVar133 * (fVar121 + fVar154)) * fVar147 +
                 (fVar133 * (fVar113 + fStack_12cc) - (fVar127 + fVar101) * fVar67) *
                 local_136c.m128[1] +
                 ((fVar121 + fVar154) * fVar67 - (fVar113 + fStack_12cc) * fVar155) *
                 (float)local_1328._4_4_;
            fVar98 = fVar89 + (float)local_1258._0_4_ + auVar72._0_4_;
            fVar100 = fVar99 + (float)local_1258._4_4_ + auVar72._4_4_;
            fVar101 = local_fd8._8_4_ + fStack_1250 + auVar72._8_4_;
            fVar108 = local_fd8._12_4_ + fStack_124c + auVar72._12_4_;
            auVar115._8_4_ = local_fd8._8_4_;
            auVar115._0_8_ = local_fd8._0_8_;
            auVar115._12_4_ = local_fd8._12_4_;
            auVar29._4_4_ = local_1258._4_4_;
            auVar29._0_4_ = local_1258._0_4_;
            auVar29._8_4_ = fStack_1250;
            auVar29._12_4_ = fStack_124c;
            auVar73 = minps(auVar115,auVar29);
            auVar116 = minps(auVar73,auVar72);
            auVar30._4_4_ = local_1258._4_4_;
            auVar30._0_4_ = local_1258._0_4_;
            auVar30._8_4_ = fStack_1250;
            auVar30._12_4_ = fStack_124c;
            auVar73 = maxps(local_fd8,auVar30);
            auVar73 = maxps(auVar73,auVar72);
            fVar113 = ABS(fVar98) * 1.1920929e-07;
            fVar121 = ABS(fVar100) * 1.1920929e-07;
            fVar127 = ABS(fVar101) * 1.1920929e-07;
            fVar88 = ABS(fVar108) * 1.1920929e-07;
            auVar94._4_4_ = -(uint)(auVar73._4_4_ <= fVar121);
            auVar94._0_4_ = -(uint)(auVar73._0_4_ <= fVar113);
            auVar94._8_4_ = -(uint)(auVar73._8_4_ <= fVar127);
            auVar94._12_4_ = -(uint)(auVar73._12_4_ <= fVar88);
            auVar117._4_4_ = -(uint)(-fVar121 <= auVar116._4_4_);
            auVar117._0_4_ = -(uint)(-fVar113 <= auVar116._0_4_);
            auVar117._8_4_ = -(uint)(-fVar127 <= auVar116._8_4_);
            auVar117._12_4_ = -(uint)(-fVar88 <= auVar116._12_4_);
            auVar94 = auVar94 | auVar117;
            local_12d8 = local_10d0 * 0x60 + (uVar42 & 0xfffffffffffffff0);
            uVar38 = (undefined4)((ulong)local_12d8 >> 0x20);
            uVar45 = movmskps((int)local_12d8,auVar94);
            if (uVar45 != 0) {
              local_fe8 = fVar98;
              fStack_fe4 = fVar100;
              fStack_fe0 = fVar101;
              fStack_fdc = fVar108;
              local_1178 = (float)local_1258._0_4_;
              fStack_1174 = (float)local_1258._4_4_;
              fStack_1170 = fStack_1250;
              fStack_116c = fStack_124c;
              local_ff8 = auVar94;
              auVar73 = local_ff8;
              uVar47 = -(uint)(ABS(local_fc8 * fVar149) <= ABS(local_fa8 * fVar102));
              uVar48 = -(uint)(ABS(fStack_fc4 * fVar151) <= ABS(fStack_fa4 * fVar105));
              uVar52 = -(uint)(ABS(fStack_fc0 * fVar153) <= ABS(fStack_fa0 * fVar106));
              uVar55 = -(uint)(ABS(fStack_fbc * fVar155) <= ABS(fStack_f9c * fVar107));
              uVar51 = -(uint)(ABS(fVar135 * fVar128) <= ABS(fVar134 * local_fc8));
              uVar49 = -(uint)(ABS(fVar137 * fVar131) <= ABS(fVar136 * fStack_fc4));
              uVar53 = -(uint)(ABS(fVar139 * fVar132) <= ABS(fVar138 * fStack_fc0));
              uVar56 = -(uint)(ABS(fVar141 * fVar133) <= ABS(fVar140 * fStack_fbc));
              uVar46 = -(uint)(ABS(fVar102 * fVar58) <= ABS(local_fb8 * fVar135));
              uVar50 = -(uint)(ABS(fVar105 * fVar65) <= ABS(fStack_fb4 * fVar137));
              uVar54 = -(uint)(ABS(fVar106 * fVar66) <= ABS(fStack_fb0 * fVar139));
              uVar57 = -(uint)(ABS(fVar107 * fVar67) <= ABS(fStack_fac * fVar141));
              local_1238 = (float)(~uVar47 & (uint)(local_fb8 * local_fc8 - local_fa8 * fVar102) |
                                  (uint)(fVar102 * fVar128 - local_fc8 * fVar149) & uVar47);
              fStack_1234 = (float)(~uVar48 & (uint)(fStack_fb4 * fStack_fc4 - fStack_fa4 * fVar105)
                                   | (uint)(fVar105 * fVar131 - fStack_fc4 * fVar151) & uVar48);
              fStack_1230 = (float)(~uVar52 & (uint)(fStack_fb0 * fStack_fc0 - fStack_fa0 * fVar106)
                                   | (uint)(fVar106 * fVar132 - fStack_fc0 * fVar153) & uVar52);
              fStack_122c = (float)(~uVar55 & (uint)(fStack_fac * fStack_fbc - fStack_f9c * fVar107)
                                   | (uint)(fVar107 * fVar133 - fStack_fbc * fVar155) & uVar55);
              local_1248._4_4_ = fVar100;
              local_1248._0_4_ = fVar98;
              local_1248._8_4_ = fVar101;
              local_1248._12_4_ = fVar108;
              local_1228 = (float)(~uVar51 & (uint)(local_fa8 * fVar135 - fVar134 * local_fc8) |
                                  (uint)(local_fc8 * fVar58 - fVar135 * fVar128) & uVar51);
              fStack_1224 = (float)(~uVar49 & (uint)(fStack_fa4 * fVar137 - fVar136 * fStack_fc4) |
                                   (uint)(fStack_fc4 * fVar65 - fVar137 * fVar131) & uVar49);
              fStack_1220 = (float)(~uVar53 & (uint)(fStack_fa0 * fVar139 - fVar138 * fStack_fc0) |
                                   (uint)(fStack_fc0 * fVar66 - fVar139 * fVar132) & uVar53);
              fStack_121c = (float)(~uVar56 & (uint)(fStack_f9c * fVar141 - fVar140 * fStack_fbc) |
                                   (uint)(fStack_fbc * fVar67 - fVar141 * fVar133) & uVar56);
              local_1218 = (float)(~uVar46 & (uint)(fVar134 * fVar102 - local_fb8 * fVar135) |
                                  (uint)(fVar135 * fVar149 - fVar102 * fVar58) & uVar46);
              fStack_1214 = (float)(~uVar50 & (uint)(fVar136 * fVar105 - fStack_fb4 * fVar137) |
                                   (uint)(fVar137 * fVar151 - fVar105 * fVar65) & uVar50);
              fStack_1210 = (float)(~uVar54 & (uint)(fVar138 * fVar106 - fStack_fb0 * fVar139) |
                                   (uint)(fVar139 * fVar153 - fVar106 * fVar66) & uVar54);
              fStack_120c = (float)(~uVar57 & (uint)(fVar140 * fVar107 - fStack_fac * fVar141) |
                                   (uint)(fVar141 * fVar155 - fVar107 * fVar67) & uVar57);
              fVar88 = fVar147 * local_1238 +
                       local_136c.m128[1] * local_1228 + (float)local_1328._4_4_ * local_1218;
              fVar102 = fVar147 * fStack_1234 +
                        local_136c.m128[1] * fStack_1224 + (float)local_1328._4_4_ * fStack_1214;
              fVar105 = fVar147 * fStack_1230 +
                        local_136c.m128[1] * fStack_1220 + (float)local_1328._4_4_ * fStack_1210;
              fVar106 = fVar147 * fStack_122c +
                        local_136c.m128[1] * fStack_121c + (float)local_1328._4_4_ * fStack_120c;
              fVar88 = fVar88 + fVar88;
              fVar102 = fVar102 + fVar102;
              fVar105 = fVar105 + fVar105;
              fVar106 = fVar106 + fVar106;
              auVar59._0_4_ = local_f98 * local_1228 + local_f88 * local_1218;
              auVar59._4_4_ = fStack_f94 * fStack_1224 + fStack_f84 * fStack_1214;
              auVar59._8_4_ = fStack_f90 * fStack_1220 + fStack_f80 * fStack_1210;
              auVar59._12_4_ = fStack_f8c * fStack_121c + fStack_f7c * fStack_120c;
              fVar58 = local_1298 * local_1238 + auVar59._0_4_;
              fVar65 = fStack_1294 * fStack_1234 + auVar59._4_4_;
              fVar66 = fStack_1290 * fStack_1230 + auVar59._8_4_;
              fVar67 = fStack_128c * fStack_122c + auVar59._12_4_;
              auVar26._4_4_ = fVar102;
              auVar26._0_4_ = fVar88;
              auVar26._8_4_ = fVar105;
              auVar26._12_4_ = fVar106;
              auVar116 = rcpps(auVar59,auVar26);
              fVar113 = auVar116._0_4_;
              fVar121 = auVar116._4_4_;
              fVar127 = auVar116._8_4_;
              fVar147 = auVar116._12_4_;
              local_136c.m128[1] =
                   ((1.0 - fVar88 * fVar113) * fVar113 + fVar113) * (fVar58 + fVar58);
              local_136c.m128[2] =
                   ((1.0 - fVar102 * fVar121) * fVar121 + fVar121) * (fVar65 + fVar65);
              local_136c.m128[3] =
                   ((1.0 - fVar105 * fVar127) * fVar127 + fVar127) * (fVar66 + fVar66);
              fStack_135c = ((1.0 - fVar106 * fVar147) * fVar147 + fVar147) * (fVar67 + fVar67);
              fVar113 = (ray->super_RayK<1>).tfar;
              fVar121 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar60._4_4_ = -(uint)(fVar121 <= local_136c.m128[2]);
              auVar60._0_4_ = -(uint)(fVar121 <= local_136c.m128[1]);
              auVar60._8_4_ = -(uint)(fVar121 <= local_136c.m128[3]);
              auVar60._12_4_ = -(uint)(fVar121 <= fStack_135c);
              local_ff8._0_4_ = auVar94._0_4_;
              local_ff8._4_4_ = auVar94._4_4_;
              local_ff8._8_4_ = auVar94._8_4_;
              local_ff8._12_4_ = auVar94._12_4_;
              local_1208._0_4_ =
                   -(uint)(fVar88 != 0.0) & local_ff8._0_4_ &
                   -(uint)(local_136c.m128[1] <= fVar113 && fVar121 <= local_136c.m128[1]);
              local_1208._4_4_ =
                   -(uint)(fVar102 != 0.0) & local_ff8._4_4_ &
                   -(uint)(local_136c.m128[2] <= fVar113 && fVar121 <= local_136c.m128[2]);
              local_1208._8_4_ =
                   -(uint)(fVar105 != 0.0) & local_ff8._8_4_ &
                   -(uint)(local_136c.m128[3] <= fVar113 && fVar121 <= local_136c.m128[3]);
              local_1208._12_4_ =
                   -(uint)(fVar106 != 0.0) & local_ff8._12_4_ &
                   -(uint)(fStack_135c <= fVar113 && fVar121 <= fStack_135c);
              auVar27._4_4_ = local_1208._4_4_;
              auVar27._0_4_ = local_1208._0_4_;
              auVar27._8_4_ = local_1208._8_4_;
              auVar27._12_4_ = local_1208._12_4_;
              uVar45 = movmskps(uVar45,auVar27);
              local_ff8 = auVar73;
              if (uVar45 != 0) {
                fStack_1260 = local_fd8._8_4_;
                local_1268 = (undefined1  [8])local_fd8._0_8_;
                fStack_125c = local_fd8._12_4_;
                local_11d8[0] = local_136c.m128[1];
                local_11d8[1] = local_136c.m128[2];
                local_11d8[2] = local_136c.m128[3];
                local_11d8[3] = fStack_135c;
                local_1198 = local_1008;
                local_1338._4_4_ = local_1208._4_4_;
                local_1338._0_4_ = local_1208._0_4_;
                local_1338._8_4_ = local_1208._8_4_;
                local_1338._12_4_ = local_1208._12_4_;
                auVar73 = rcpps(auVar60,local_1248);
                fVar113 = auVar73._0_4_;
                fVar121 = auVar73._4_4_;
                fVar127 = auVar73._8_4_;
                fVar147 = auVar73._12_4_;
                fVar58 = (float)DAT_01feca10;
                fVar65 = DAT_01feca10._4_4_;
                fVar66 = DAT_01feca10._12_4_;
                fVar67 = DAT_01feca10._8_4_;
                fVar113 = (float)(-(uint)(1e-18 <= ABS(fVar98)) &
                                 (uint)((fVar58 - fVar98 * fVar113) * fVar113 + fVar113));
                fVar121 = (float)(-(uint)(1e-18 <= ABS(fVar100)) &
                                 (uint)((fVar65 - fVar100 * fVar121) * fVar121 + fVar121));
                fVar127 = (float)(-(uint)(1e-18 <= ABS(fVar101)) &
                                 (uint)((fVar67 - fVar101 * fVar127) * fVar127 + fVar127));
                fVar147 = (float)(-(uint)(1e-18 <= ABS(fVar108)) &
                                 (uint)((fVar66 - fVar108 * fVar147) * fVar147 + fVar147));
                auVar85._0_4_ = fVar89 * fVar113;
                auVar85._4_4_ = fVar99 * fVar121;
                auVar85._8_4_ = local_fd8._8_4_ * fVar127;
                auVar85._12_4_ = local_fd8._12_4_ * fVar147;
                auVar73 = minps(auVar85,_DAT_01feca10);
                auVar143._0_4_ = fVar113 * (float)local_1258._0_4_;
                auVar143._4_4_ = fVar121 * (float)local_1258._4_4_;
                auVar143._8_4_ = fVar127 * fStack_1250;
                auVar143._12_4_ = fVar147 * fStack_124c;
                auVar116 = minps(auVar143,_DAT_01feca10);
                local_11f8 = (float)((uint)auVar73._0_4_ & local_1038._0_4_ |
                                    (uint)(fVar58 - auVar73._0_4_) & local_1008._0_4_);
                uStack_11f4 = (uint)auVar73._4_4_ & local_1038._4_4_ |
                              (uint)(fVar65 - auVar73._4_4_) & local_1008._4_4_;
                uStack_11f0 = (uint)auVar73._8_4_ & local_1038._8_4_ |
                              (uint)(fVar67 - auVar73._8_4_) & local_1008._8_4_;
                uStack_11ec = (uint)auVar73._12_4_ & local_1038._12_4_ |
                              (uint)(fVar66 - auVar73._12_4_) & local_1008._12_4_;
                local_11e8 = (float)((uint)auVar116._0_4_ & local_1038._0_4_ |
                                    (uint)(fVar58 - auVar116._0_4_) & local_1008._0_4_);
                uStack_11e4 = (uint)auVar116._4_4_ & local_1038._4_4_ |
                              (uint)(fVar65 - auVar116._4_4_) & local_1008._4_4_;
                uStack_11e0 = (uint)auVar116._8_4_ & local_1038._8_4_ |
                              (uint)(fVar67 - auVar116._8_4_) & local_1008._8_4_;
                uStack_11dc = (uint)auVar116._12_4_ & local_1038._12_4_ |
                              (uint)(fVar66 - auVar116._12_4_) & local_1008._12_4_;
                local_11c8[0] = local_1238;
                local_11c8[1] = fStack_1234;
                local_11c8[2] = fStack_1230;
                local_11c8[3] = fStack_122c;
                local_11b8[0] = local_1228;
                local_11b8[1] = fStack_1224;
                local_11b8[2] = fStack_1220;
                local_11b8[3] = fStack_121c;
                local_11a8[0] = local_1218;
                local_11a8[1] = fStack_1214;
                local_11a8[2] = fStack_1210;
                local_11a8[3] = fStack_120c;
                auVar61._0_4_ = (uint)local_136c.m128[1] & local_1208._0_4_;
                auVar61._4_4_ = (uint)local_136c.m128[2] & local_1208._4_4_;
                auVar61._8_4_ = (uint)local_136c.m128[3] & local_1208._8_4_;
                auVar61._12_4_ = (uint)fStack_135c & local_1208._12_4_;
                auVar95._0_8_ = CONCAT44(~local_1208._4_4_,~local_1208._0_4_) & 0x7f8000007f800000;
                auVar95._8_4_ = ~local_1208._8_4_ & 0x7f800000;
                auVar95._12_4_ = ~local_1208._12_4_ & 0x7f800000;
                auVar95 = auVar95 | auVar61;
                auVar77._4_4_ = auVar95._0_4_;
                auVar77._0_4_ = auVar95._4_4_;
                auVar77._8_4_ = auVar95._12_4_;
                auVar77._12_4_ = auVar95._8_4_;
                auVar73 = minps(auVar77,auVar95);
                auVar62._0_8_ = auVar73._8_8_;
                auVar62._8_4_ = auVar73._0_4_;
                auVar62._12_4_ = auVar73._4_4_;
                auVar73 = minps(auVar62,auVar73);
                auVar63._0_4_ = -(uint)(auVar73._0_4_ == auVar95._0_4_) & local_1208._0_4_;
                auVar63._4_4_ = -(uint)(auVar73._4_4_ == auVar95._4_4_) & local_1208._4_4_;
                auVar63._8_4_ = -(uint)(auVar73._8_4_ == auVar95._8_4_) & local_1208._8_4_;
                auVar63._12_4_ = -(uint)(auVar73._12_4_ == auVar95._12_4_) & local_1208._12_4_;
                iVar33 = movmskps(uVar45,auVar63);
                uVar45 = local_1208._0_4_;
                uVar47 = local_1208._4_4_;
                uVar51 = local_1208._8_4_;
                uVar46 = local_1208._12_4_;
                if (iVar33 != 0) {
                  uVar45 = auVar63._0_4_;
                  uVar47 = auVar63._4_4_;
                  uVar51 = auVar63._8_4_;
                  uVar46 = auVar63._12_4_;
                }
                auVar28._4_4_ = uVar47;
                auVar28._0_4_ = uVar45;
                auVar28._8_4_ = uVar51;
                auVar28._12_4_ = uVar46;
                uVar34 = movmskps(iVar33,auVar28);
                paVar40 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0;
                if (CONCAT44(uVar38,uVar34) != 0) {
                  for (; (CONCAT44(uVar38,uVar34) >> (long)paVar40 & 1) == 0;
                      paVar40 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                                ((long)&(paVar40->field_1).x + 1)) {
                  }
                }
                local_1100 = pSVar37;
                do {
                  uVar45 = puVar44[(long)paVar40];
                  paVar35 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar45;
                  pGVar22 = (pSVar37->geometries).items[(long)paVar35].ptr;
                  if ((pGVar22->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1338 + (long)paVar40 * 4) = 0;
                  }
                  else {
                    pRVar23 = context->args;
                    if ((pRVar23->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar113 = (&local_11f8)[(long)paVar40];
                      fVar121 = (&local_11e8)[(long)paVar40];
                      (ray->super_RayK<1>).tfar = local_11d8[(long)paVar40];
                      (ray->Ng).field_0.field_0.x = local_11c8[(long)paVar40];
                      (ray->Ng).field_0.field_0.y = local_11b8[(long)paVar40];
                      (ray->Ng).field_0.field_0.z = local_11a8[(long)paVar40];
                      ray->u = fVar113;
                      ray->v = fVar121;
                      ray->primID = *(uint *)(local_12d8 + 0x50 + (long)paVar40 * 4);
                      ray->geomID = uVar45;
                      pRVar24 = context->user;
                      ray->instID[0] = pRVar24->instID[0];
                      uVar45 = pRVar24->instPrimID[0];
                      uVar38 = 0;
                      ray->instPrimID[0] = uVar45;
                      break;
                    }
                    local_1308.context = context->user;
                    local_12c8 = local_11c8[(long)paVar40];
                    local_12c4 = local_11b8[(long)paVar40];
                    local_12c0 = local_11a8[(long)paVar40];
                    local_12bc = (&local_11f8)[(long)paVar40];
                    local_12b8 = (&local_11e8)[(long)paVar40];
                    local_12b4 = *(undefined4 *)(local_12d8 + 0x50 + (long)paVar40 * 4);
                    local_12b0 = uVar45;
                    local_12ac = (local_1308.context)->instID[0];
                    local_12a8 = (local_1308.context)->instPrimID[0];
                    local_1298 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_11d8[(long)paVar40];
                    local_136c.m128[0] = -NAN;
                    local_1308.valid = (int *)&local_136c;
                    local_1308.geometryUserPtr = pGVar22->userPtr;
                    local_1308.ray = (RTCRayN *)ray;
                    local_1308.hit = (RTCHitN *)&local_12c8;
                    local_1308.N = 1;
                    if (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00df80f7:
                      if (pRVar23->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar23->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar22->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar23->filter)(&local_1308);
                          context = local_1340;
                        }
                        if (*(float *)local_1308.valid == 0.0) goto LAB_00df81d1;
                      }
                      *(float *)((long)local_1308.ray + 0x30) = *(float *)local_1308.hit;
                      *(float *)((long)local_1308.ray + 0x34) = *(float *)(local_1308.hit + 4);
                      *(float *)((long)local_1308.ray + 0x38) = *(float *)(local_1308.hit + 8);
                      *(float *)((long)local_1308.ray + 0x3c) = *(float *)(local_1308.hit + 0xc);
                      *(float *)((long)local_1308.ray + 0x40) = *(float *)(local_1308.hit + 0x10);
                      *(float *)((long)local_1308.ray + 0x44) = *(float *)(local_1308.hit + 0x14);
                      *(float *)((long)local_1308.ray + 0x48) = *(float *)(local_1308.hit + 0x18);
                      *(float *)((long)local_1308.ray + 0x4c) = *(float *)(local_1308.hit + 0x1c);
                      *(float *)((long)local_1308.ray + 0x50) = *(float *)(local_1308.hit + 0x20);
                      paVar35 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1308.ray;
                    }
                    else {
                      local_1328 = in_R8;
                      (*pGVar22->intersectionFilterN)(&local_1308);
                      in_R8 = local_1328;
                      context = local_1340;
                      if (*(float *)local_1308.valid != 0.0) goto LAB_00df80f7;
LAB_00df81d1:
                      (ray->super_RayK<1>).tfar = local_1298;
                      paVar35 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1308.valid;
                    }
                    *(undefined4 *)(local_1338 + (long)paVar40 * 4) = 0;
                    fVar113 = (ray->super_RayK<1>).tfar;
                    local_1338._0_4_ = -(uint)(local_136c.m128[1] <= fVar113) & local_1338._0_4_;
                    local_1338._4_4_ = -(uint)(local_136c.m128[2] <= fVar113) & local_1338._4_4_;
                    local_1338._8_4_ = -(uint)(local_136c.m128[3] <= fVar113) & local_1338._8_4_;
                    local_1338._12_4_ = -(uint)(fStack_135c <= fVar113) & local_1338._12_4_;
                    pSVar37 = local_1100;
                  }
                  uVar38 = (undefined4)((ulong)paVar35 >> 0x20);
                  uVar45 = movmskps((int)paVar35,local_1338);
                  if (uVar45 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = local_1340;
                  paVar40 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1308.valid;
                } while( true );
              }
            }
            fVar113 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar121 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar127 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_136c.m128[1] = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar147 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar58 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_136c.m128[2] = local_136c.m128[1];
            local_136c.m128[3] = local_136c.m128[1];
            fStack_135c = local_136c.m128[1];
            local_1128._0_4_ = (float)local_1128 - fVar113;
            local_1128._4_4_ = local_1128._4_4_ - fVar113;
            fStack_1120 = fStack_1120 - fVar113;
            fStack_111c = fStack_111c - fVar113;
            local_1138 = local_1138 - fVar121;
            fStack_1134 = fStack_1134 - fVar121;
            fStack_1130 = fStack_1130 - fVar121;
            fStack_112c = fStack_112c - fVar121;
            local_1288._0_4_ = (float)local_1288 - fVar127;
            local_1288._4_4_ = local_1288._4_4_ - fVar127;
            fStack_1280 = fStack_1280 - fVar127;
            fStack_127c = fStack_127c - fVar127;
            fVar155 = (float)local_1168 - fVar113;
            fVar157 = local_1168._4_4_ - fVar113;
            fVar159 = fStack_1160 - fVar113;
            fVar161 = fStack_115c - fVar113;
            fVar65 = (float)local_1318._0_4_ - fVar121;
            fVar88 = (float)local_1318._4_4_ - fVar121;
            fVar101 = fStack_1310 - fVar121;
            fVar89 = fStack_130c - fVar121;
            fVar66 = local_1358 - fVar127;
            fVar98 = fStack_1354 - fVar127;
            fVar108 = fStack_1350 - fVar127;
            fVar99 = fStack_134c - fVar127;
            fVar149 = local_1158 - fVar113;
            fVar150 = fStack_1154 - fVar113;
            fVar151 = fStack_1150 - fVar113;
            fVar113 = fStack_114c - fVar113;
            fVar152 = local_1148 - fVar121;
            fVar153 = fStack_1144 - fVar121;
            fVar154 = fStack_1140 - fVar121;
            fVar121 = fStack_113c - fVar121;
            fVar138 = (float)local_1278 - fVar127;
            fVar139 = local_1278._4_4_ - fVar127;
            fVar140 = fStack_1270 - fVar127;
            fVar127 = fStack_126c - fVar127;
            local_1148 = fVar149 - (float)local_1128;
            fStack_1144 = fVar150 - local_1128._4_4_;
            fStack_1140 = fVar151 - fStack_1120;
            fStack_113c = fVar113 - fStack_111c;
            fVar132 = fVar152 - local_1138;
            fVar134 = fVar153 - fStack_1134;
            fStack_1160 = fVar154 - fStack_1130;
            fStack_115c = fVar121 - fStack_112c;
            fVar120 = fVar138 - (float)local_1288;
            fVar125 = fVar139 - local_1288._4_4_;
            fStack_1150 = fVar140 - fStack_1280;
            fStack_114c = fVar127 - fStack_127c;
            _local_1158 = CONCAT44(fVar125,fVar120);
            local_1278 = CONCAT44(fVar58,fVar58);
            fStack_1270 = fVar58;
            fStack_126c = fVar58;
            local_1168 = CONCAT44(fVar134,fVar132);
            fVar102 = local_1138 - fVar65;
            fVar105 = fStack_1134 - fVar88;
            fVar106 = fStack_1130 - fVar101;
            fVar107 = fStack_112c - fVar89;
            fVar133 = (float)local_1288 - fVar66;
            fVar135 = local_1288._4_4_ - fVar98;
            fVar136 = fStack_1280 - fVar108;
            fVar137 = fStack_127c - fVar99;
            fVar67 = (fVar132 * (fVar138 + (float)local_1288) - fVar120 * (fVar152 + local_1138)) *
                     local_136c.m128[1] +
                     (fVar120 * (fVar149 + (float)local_1128) -
                     (fVar138 + (float)local_1288) * local_1148) * fVar147 +
                     ((fVar152 + local_1138) * local_1148 - (fVar149 + (float)local_1128) * fVar132)
                     * fVar58;
            fVar100 = (fVar134 * (fVar139 + local_1288._4_4_) - fVar125 * (fVar153 + fStack_1134)) *
                      local_136c.m128[1] +
                      (fVar125 * (fVar150 + local_1128._4_4_) -
                      (fVar139 + local_1288._4_4_) * fStack_1144) * fVar147 +
                      ((fVar153 + fStack_1134) * fStack_1144 -
                      (fVar150 + local_1128._4_4_) * fVar134) * fVar58;
            local_1328 = (undefined1  [8])CONCAT44(fVar100,fVar67);
            fStack_1320 = (fStack_1160 * (fVar140 + fStack_1280) -
                          fStack_1150 * (fVar154 + fStack_1130)) * local_136c.m128[1] +
                          (fStack_1150 * (fVar151 + fStack_1120) -
                          (fVar140 + fStack_1280) * fStack_1140) * fVar147 +
                          ((fVar154 + fStack_1130) * fStack_1140 -
                          (fVar151 + fStack_1120) * fStack_1160) * fVar58;
            fStack_131c = (fStack_115c * (fVar127 + fStack_127c) -
                          fStack_114c * (fVar121 + fStack_112c)) * local_136c.m128[1] +
                          (fStack_114c * (fVar113 + fStack_111c) -
                          (fVar127 + fStack_127c) * fStack_113c) * fVar147 +
                          ((fVar121 + fStack_112c) * fStack_113c -
                          (fVar113 + fStack_111c) * fStack_115c) * fVar58;
            fVar122 = (float)local_1128 - fVar155;
            fVar126 = local_1128._4_4_ - fVar157;
            fVar128 = fStack_1120 - fVar159;
            fVar131 = fStack_111c - fVar161;
            local_1318._0_4_ =
                 (fVar102 * ((float)local_1288 + fVar66) - fVar133 * (local_1138 + fVar65)) *
                 local_136c.m128[1] +
                 (fVar133 * ((float)local_1128 + fVar155) - ((float)local_1288 + fVar66) * fVar122)
                 * fVar147 +
                 ((local_1138 + fVar65) * fVar122 - ((float)local_1128 + fVar155) * fVar102) *
                 fVar58;
            local_1318._4_4_ =
                 (fVar105 * (local_1288._4_4_ + fVar98) - fVar135 * (fStack_1134 + fVar88)) *
                 local_136c.m128[1] +
                 (fVar135 * (local_1128._4_4_ + fVar157) - (local_1288._4_4_ + fVar98) * fVar126) *
                 fVar147 + ((fStack_1134 + fVar88) * fVar126 -
                           (local_1128._4_4_ + fVar157) * fVar105) * fVar58;
            fStack_1310 = (fVar106 * (fStack_1280 + fVar108) - fVar136 * (fStack_1130 + fVar101)) *
                          local_136c.m128[1] +
                          (fVar136 * (fStack_1120 + fVar159) - (fStack_1280 + fVar108) * fVar128) *
                          fVar147 + ((fStack_1130 + fVar101) * fVar128 -
                                    (fStack_1120 + fVar159) * fVar106) * fVar58;
            fStack_130c = (fVar107 * (fStack_127c + fVar99) - fVar137 * (fStack_112c + fVar89)) *
                          local_136c.m128[1] +
                          (fVar137 * (fStack_111c + fVar161) - (fStack_127c + fVar99) * fVar131) *
                          fVar147 + ((fStack_112c + fVar89) * fVar131 -
                                    (fStack_111c + fVar161) * fVar107) * fVar58;
            fVar111 = fVar155 - fVar149;
            fVar112 = fVar157 - fVar150;
            fVar114 = fVar159 - fVar151;
            fVar119 = fVar161 - fVar113;
            fVar141 = fVar65 - fVar152;
            fVar142 = fVar88 - fVar153;
            fVar146 = fVar101 - fVar154;
            fVar148 = fVar89 - fVar121;
            fVar156 = fVar66 - fVar138;
            fVar158 = fVar98 - fVar139;
            fVar160 = fVar108 - fVar140;
            fVar162 = fVar99 - fVar127;
            _local_1358 = CONCAT44(fVar147,fVar147);
            _fStack_1350 = CONCAT44(fVar147,fVar147);
            auVar123._0_4_ =
                 (fVar141 * (fVar138 + fVar66) - fVar156 * (fVar152 + fVar65)) * local_136c.m128[1]
                 + (fVar156 * (fVar149 + fVar155) - (fVar138 + fVar66) * fVar111) * fVar147 +
                   ((fVar152 + fVar65) * fVar111 - (fVar149 + fVar155) * fVar141) * fVar58;
            auVar123._4_4_ =
                 (fVar142 * (fVar139 + fVar98) - fVar158 * (fVar153 + fVar88)) * local_136c.m128[1]
                 + (fVar158 * (fVar150 + fVar157) - (fVar139 + fVar98) * fVar112) * fVar147 +
                   ((fVar153 + fVar88) * fVar112 - (fVar150 + fVar157) * fVar142) * fVar58;
            auVar123._8_4_ =
                 (fVar146 * (fVar140 + fVar108) - fVar160 * (fVar154 + fVar101)) *
                 local_136c.m128[1] +
                 (fVar160 * (fVar151 + fVar159) - (fVar140 + fVar108) * fVar114) * fVar147 +
                 ((fVar154 + fVar101) * fVar114 - (fVar151 + fVar159) * fVar146) * fVar58;
            auVar123._12_4_ =
                 (fVar148 * (fVar127 + fVar99) - fVar162 * (fVar121 + fVar89)) * local_136c.m128[1]
                 + (fVar162 * (fVar113 + fVar161) - (fVar127 + fVar99) * fVar119) * fVar147 +
                   ((fVar121 + fVar89) * fVar119 - (fVar113 + fVar161) * fVar148) * fVar58;
            local_1298 = fVar67 + (float)local_1318._0_4_ + auVar123._0_4_;
            fStack_1294 = fVar100 + (float)local_1318._4_4_ + auVar123._4_4_;
            fStack_1290 = fStack_1320 + fStack_1310 + auVar123._8_4_;
            fStack_128c = fStack_131c + fStack_130c + auVar123._12_4_;
            auVar129._8_4_ = fStack_1320;
            auVar129._0_8_ = local_1328;
            auVar129._12_4_ = fStack_131c;
            auVar73 = minps(auVar129,_local_1318);
            auVar116 = minps(auVar73,auVar123);
            auVar78._8_4_ = fStack_1320;
            auVar78._0_8_ = local_1328;
            auVar78._12_4_ = fStack_131c;
            auVar73 = maxps(auVar78,_local_1318);
            auVar73 = maxps(auVar73,auVar123);
            fVar113 = ABS(local_1298) * 1.1920929e-07;
            fVar121 = ABS(fStack_1294) * 1.1920929e-07;
            fVar127 = ABS(fStack_1290) * 1.1920929e-07;
            fVar65 = ABS(fStack_128c) * 1.1920929e-07;
            auVar79._4_4_ = -(uint)(auVar73._4_4_ <= fVar121);
            auVar79._0_4_ = -(uint)(auVar73._0_4_ <= fVar113);
            auVar79._8_4_ = -(uint)(auVar73._8_4_ <= fVar127);
            auVar79._12_4_ = -(uint)(auVar73._12_4_ <= fVar65);
            auVar130._4_4_ = -(uint)(-fVar121 <= auVar116._4_4_);
            auVar130._0_4_ = -(uint)(-fVar113 <= auVar116._0_4_);
            auVar130._8_4_ = -(uint)(-fVar127 <= auVar116._8_4_);
            auVar130._12_4_ = -(uint)(-fVar65 <= auVar116._12_4_);
            auVar79 = auVar79 | auVar130;
            iVar33 = movmskps(uVar45,auVar79);
            if (iVar33 != 0) {
              uVar45 = -(uint)(ABS(fVar133 * fVar141) <= ABS(fVar120 * fVar102));
              uVar46 = -(uint)(ABS(fVar135 * fVar142) <= ABS(fVar125 * fVar105));
              uVar50 = -(uint)(ABS(fVar136 * fVar146) <= ABS(fStack_1150 * fVar106));
              uVar54 = -(uint)(ABS(fVar137 * fVar148) <= ABS(fStack_114c * fVar107));
              uVar47 = -(uint)(ABS(fVar122 * fVar156) <= ABS(local_1148 * fVar133));
              uVar48 = -(uint)(ABS(fVar126 * fVar158) <= ABS(fStack_1144 * fVar135));
              uVar52 = -(uint)(ABS(fVar128 * fVar160) <= ABS(fStack_1140 * fVar136));
              uVar55 = -(uint)(ABS(fVar131 * fVar162) <= ABS(fStack_113c * fVar137));
              local_1248._4_4_ = fStack_1294;
              local_1248._0_4_ = local_1298;
              local_1248._8_4_ = fStack_1290;
              local_1248._12_4_ = fStack_128c;
              uVar51 = -(uint)(ABS(fVar102 * fVar111) <= ABS(fVar132 * fVar122));
              uVar49 = -(uint)(ABS(fVar105 * fVar112) <= ABS(fVar134 * fVar126));
              uVar53 = -(uint)(ABS(fVar106 * fVar114) <= ABS(fStack_1160 * fVar128));
              uVar56 = -(uint)(ABS(fVar107 * fVar119) <= ABS(fStack_115c * fVar131));
              local_1238 = (float)(~uVar45 & (uint)(fVar132 * fVar133 - fVar120 * fVar102) |
                                  (uint)(fVar102 * fVar156 - fVar133 * fVar141) & uVar45);
              fStack_1234 = (float)(~uVar46 & (uint)(fVar134 * fVar135 - fVar125 * fVar105) |
                                   (uint)(fVar105 * fVar158 - fVar135 * fVar142) & uVar46);
              fStack_1230 = (float)(~uVar50 & (uint)(fStack_1160 * fVar136 - fStack_1150 * fVar106)
                                   | (uint)(fVar106 * fVar160 - fVar136 * fVar146) & uVar50);
              fStack_122c = (float)(~uVar54 & (uint)(fStack_115c * fVar137 - fStack_114c * fVar107)
                                   | (uint)(fVar107 * fVar162 - fVar137 * fVar148) & uVar54);
              local_1228 = (float)(~uVar47 & (uint)(fVar120 * fVar122 - local_1148 * fVar133) |
                                  (uint)(fVar133 * fVar111 - fVar122 * fVar156) & uVar47);
              fStack_1224 = (float)(~uVar48 & (uint)(fVar125 * fVar126 - fStack_1144 * fVar135) |
                                   (uint)(fVar135 * fVar112 - fVar126 * fVar158) & uVar48);
              fStack_1220 = (float)(~uVar52 & (uint)(fStack_1150 * fVar128 - fStack_1140 * fVar136)
                                   | (uint)(fVar136 * fVar114 - fVar128 * fVar160) & uVar52);
              fStack_121c = (float)(~uVar55 & (uint)(fStack_114c * fVar131 - fStack_113c * fVar137)
                                   | (uint)(fVar137 * fVar119 - fVar131 * fVar162) & uVar55);
              local_1218 = (float)(~uVar51 & (uint)(local_1148 * fVar102 - fVar132 * fVar122) |
                                  (uint)(fVar122 * fVar141 - fVar102 * fVar111) & uVar51);
              fStack_1214 = (float)(~uVar49 & (uint)(fStack_1144 * fVar105 - fVar134 * fVar126) |
                                   (uint)(fVar126 * fVar142 - fVar105 * fVar112) & uVar49);
              fStack_1210 = (float)(~uVar53 & (uint)(fStack_1140 * fVar106 - fStack_1160 * fVar128)
                                   | (uint)(fVar128 * fVar146 - fVar106 * fVar114) & uVar53);
              fStack_120c = (float)(~uVar56 & (uint)(fStack_113c * fVar107 - fStack_115c * fVar131)
                                   | (uint)(fVar131 * fVar148 - fVar107 * fVar119) & uVar56);
              fVar113 = local_136c.m128[1] * local_1238 + fVar147 * local_1228 + fVar58 * local_1218
              ;
              fVar121 = local_136c.m128[1] * fStack_1234 +
                        fVar147 * fStack_1224 + fVar58 * fStack_1214;
              fVar127 = local_136c.m128[1] * fStack_1230 +
                        fVar147 * fStack_1220 + fVar58 * fStack_1210;
              fVar147 = local_136c.m128[1] * fStack_122c +
                        fVar147 * fStack_121c + fVar58 * fStack_120c;
              auVar144._0_4_ = fVar113 + fVar113;
              auVar144._4_4_ = fVar121 + fVar121;
              auVar144._8_4_ = fVar127 + fVar127;
              auVar144._12_4_ = fVar147 + fVar147;
              fVar113 = local_1138 * local_1228 + (float)local_1288 * local_1218;
              fVar121 = fStack_1134 * fStack_1224 + local_1288._4_4_ * fStack_1214;
              auVar86._4_4_ = fVar121;
              auVar86._0_4_ = fVar113;
              fVar127 = fStack_1130 * fStack_1220 + fStack_1280 * fStack_1210;
              fVar147 = fStack_112c * fStack_121c + fStack_127c * fStack_120c;
              auVar86._8_4_ = fVar127;
              auVar86._12_4_ = fVar147;
              fVar113 = (float)local_1128 * local_1238 + fVar113;
              fVar121 = local_1128._4_4_ * fStack_1234 + fVar121;
              fVar127 = fStack_1120 * fStack_1230 + fVar127;
              fVar147 = fStack_111c * fStack_122c + fVar147;
              auVar73 = rcpps(auVar86,auVar144);
              fVar58 = auVar73._0_4_;
              fVar65 = auVar73._4_4_;
              fVar66 = auVar73._8_4_;
              fVar88 = auVar73._12_4_;
              local_1358 = ((1.0 - auVar144._0_4_ * fVar58) * fVar58 + fVar58) * (fVar113 + fVar113)
              ;
              fStack_1354 = ((1.0 - auVar144._4_4_ * fVar65) * fVar65 + fVar65) *
                            (fVar121 + fVar121);
              fStack_1350 = ((1.0 - auVar144._8_4_ * fVar66) * fVar66 + fVar66) *
                            (fVar127 + fVar127);
              fStack_134c = ((1.0 - auVar144._12_4_ * fVar88) * fVar88 + fVar88) *
                            (fVar147 + fVar147);
              fVar113 = (ray->super_RayK<1>).tfar;
              fVar121 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar145._0_4_ =
                   -(uint)(auVar144._0_4_ != 0.0) & auVar79._0_4_ &
                   -(uint)(local_1358 <= fVar113 && fVar121 <= local_1358);
              auVar145._4_4_ =
                   -(uint)(auVar144._4_4_ != 0.0) & auVar79._4_4_ &
                   -(uint)(fStack_1354 <= fVar113 && fVar121 <= fStack_1354);
              auVar145._8_4_ =
                   -(uint)(auVar144._8_4_ != 0.0) & auVar79._8_4_ &
                   -(uint)(fStack_1350 <= fVar113 && fVar121 <= fStack_1350);
              auVar145._12_4_ =
                   -(uint)(auVar144._12_4_ != 0.0) & auVar79._12_4_ &
                   -(uint)(fStack_134c <= fVar113 && fVar121 <= fStack_134c);
              iVar33 = movmskps(iVar33,auVar145);
              if (iVar33 != 0) {
                fStack_1260 = fStack_1320;
                local_1268 = local_1328;
                fStack_125c = fStack_131c;
                _local_1258 = _local_1318;
                local_1208 = auVar145;
                local_11d8[0] = local_1358;
                local_11d8[1] = fStack_1354;
                local_11d8[2] = fStack_1350;
                local_11d8[3] = fStack_134c;
                local_1198 = local_1018;
                pSVar37 = context->scene;
                local_1338 = auVar145;
                auVar73 = rcpps(auVar79,local_1248);
                fVar113 = auVar73._0_4_;
                fVar121 = auVar73._4_4_;
                fVar127 = auVar73._8_4_;
                fVar147 = auVar73._12_4_;
                fVar66 = DAT_01feca10._4_4_;
                fVar88 = DAT_01feca10._12_4_;
                fVar58 = (float)DAT_01feca10;
                fVar65 = DAT_01feca10._8_4_;
                fVar113 = (float)(-(uint)(1e-18 <= ABS(local_1298)) &
                                 (uint)((fVar58 - local_1298 * fVar113) * fVar113 + fVar113));
                fVar121 = (float)(-(uint)(1e-18 <= ABS(fStack_1294)) &
                                 (uint)((fVar66 - fStack_1294 * fVar121) * fVar121 + fVar121));
                fVar127 = (float)(-(uint)(1e-18 <= ABS(fStack_1290)) &
                                 (uint)((fVar65 - fStack_1290 * fVar127) * fVar127 + fVar127));
                fVar147 = (float)(-(uint)(1e-18 <= ABS(fStack_128c)) &
                                 (uint)((fVar88 - fStack_128c * fVar147) * fVar147 + fVar147));
                auVar118._0_4_ = fVar67 * fVar113;
                auVar118._4_4_ = fVar100 * fVar121;
                auVar118._8_4_ = fStack_1320 * fVar127;
                auVar118._12_4_ = fStack_131c * fVar147;
                auVar73 = minps(auVar118,_DAT_01feca10);
                auVar124._0_4_ = fVar113 * (float)local_1318._0_4_;
                auVar124._4_4_ = fVar121 * (float)local_1318._4_4_;
                auVar124._8_4_ = fVar127 * fStack_1310;
                auVar124._12_4_ = fVar147 * fStack_130c;
                auVar116 = minps(auVar124,_DAT_01feca10);
                local_11f8 = (float)((uint)auVar73._0_4_ & local_1028._0_4_ |
                                    (uint)(fVar58 - auVar73._0_4_) & local_1018._0_4_);
                uStack_11f4 = (uint)auVar73._4_4_ & local_1028._4_4_ |
                              (uint)(fVar66 - auVar73._4_4_) & local_1018._4_4_;
                uStack_11f0 = (uint)auVar73._8_4_ & local_1028._8_4_ |
                              (uint)(fVar65 - auVar73._8_4_) & local_1018._8_4_;
                uStack_11ec = (uint)auVar73._12_4_ & local_1028._12_4_ |
                              (uint)(fVar88 - auVar73._12_4_) & local_1018._12_4_;
                local_11e8 = (float)((uint)auVar116._0_4_ & local_1028._0_4_ |
                                    (uint)(fVar58 - auVar116._0_4_) & local_1018._0_4_);
                uStack_11e4 = (uint)auVar116._4_4_ & local_1028._4_4_ |
                              (uint)(fVar66 - auVar116._4_4_) & local_1018._4_4_;
                uStack_11e0 = (uint)auVar116._8_4_ & local_1028._8_4_ |
                              (uint)(fVar65 - auVar116._8_4_) & local_1018._8_4_;
                uStack_11dc = (uint)auVar116._12_4_ & local_1028._12_4_ |
                              (uint)(fVar88 - auVar116._12_4_) & local_1018._12_4_;
                local_11c8[0] = local_1238;
                local_11c8[1] = fStack_1234;
                local_11c8[2] = fStack_1230;
                local_11c8[3] = fStack_122c;
                local_11b8[0] = local_1228;
                local_11b8[1] = fStack_1224;
                local_11b8[2] = fStack_1220;
                local_11b8[3] = fStack_121c;
                local_11a8[0] = local_1218;
                local_11a8[1] = fStack_1214;
                local_11a8[2] = fStack_1210;
                local_11a8[3] = fStack_120c;
                auVar64._0_4_ = (uint)local_1358 & auVar145._0_4_;
                auVar64._4_4_ = (uint)fStack_1354 & auVar145._4_4_;
                auVar64._8_4_ = (uint)fStack_1350 & auVar145._8_4_;
                auVar64._12_4_ = (uint)fStack_134c & auVar145._12_4_;
                auVar80._0_8_ = CONCAT44(~auVar145._4_4_,~auVar145._0_4_) & 0x7f8000007f800000;
                auVar80._8_4_ = ~auVar145._8_4_ & 0x7f800000;
                auVar80._12_4_ = ~auVar145._12_4_ & 0x7f800000;
                auVar80 = auVar80 | auVar64;
                auVar87._4_4_ = auVar80._0_4_;
                auVar87._0_4_ = auVar80._4_4_;
                auVar87._8_4_ = auVar80._12_4_;
                auVar87._12_4_ = auVar80._8_4_;
                auVar73 = minps(auVar87,auVar80);
                auVar96._0_8_ = auVar73._8_8_;
                auVar96._8_4_ = auVar73._0_4_;
                auVar96._12_4_ = auVar73._4_4_;
                auVar73 = minps(auVar96,auVar73);
                auVar97._0_8_ =
                     CONCAT44(-(uint)(auVar73._4_4_ == auVar80._4_4_) & auVar145._4_4_,
                              -(uint)(auVar73._0_4_ == auVar80._0_4_) & auVar145._0_4_);
                auVar97._8_4_ = -(uint)(auVar73._8_4_ == auVar80._8_4_) & auVar145._8_4_;
                auVar97._12_4_ = -(uint)(auVar73._12_4_ == auVar80._12_4_) & auVar145._12_4_;
                iVar33 = movmskps(iVar33,auVar97);
                if (iVar33 != 0) {
                  auVar145._8_4_ = auVar97._8_4_;
                  auVar145._0_8_ = auVar97._0_8_;
                  auVar145._12_4_ = auVar97._12_4_;
                }
                uVar34 = movmskps(iVar33,auVar145);
                paVar40 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0;
                if (CONCAT44(uVar38,uVar34) != 0) {
                  for (; (CONCAT44(uVar38,uVar34) >> (long)paVar40 & 1) == 0;
                      paVar40 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                                ((long)&(paVar40->field_1).x + 1)) {
                  }
                }
                do {
                  uVar45 = puVar44[(long)paVar40];
                  pGVar22 = (pSVar37->geometries).items[uVar45].ptr;
                  if ((pGVar22->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1338 + (long)paVar40 * 4) = 0;
                  }
                  else {
                    pRVar23 = context->args;
                    if ((pRVar23->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar113 = (&local_11f8)[(long)paVar40];
                      fVar121 = (&local_11e8)[(long)paVar40];
                      (ray->super_RayK<1>).tfar = local_11d8[(long)paVar40];
                      (ray->Ng).field_0.field_0.x = local_11c8[(long)paVar40];
                      (ray->Ng).field_0.field_0.y = local_11b8[(long)paVar40];
                      (ray->Ng).field_0.field_0.z = local_11a8[(long)paVar40];
                      ray->u = fVar113;
                      ray->v = fVar121;
                      ray->primID = *(uint *)(local_12d8 + 0x50 + (long)paVar40 * 4);
                      ray->geomID = uVar45;
                      pRVar24 = context->user;
                      ray->instID[0] = pRVar24->instID[0];
                      ray->instPrimID[0] = pRVar24->instPrimID[0];
                      break;
                    }
                    local_1308.context = context->user;
                    local_12c8 = local_11c8[(long)paVar40];
                    local_12c4 = local_11b8[(long)paVar40];
                    local_12c0 = local_11a8[(long)paVar40];
                    local_12bc = (&local_11f8)[(long)paVar40];
                    local_12b8 = (&local_11e8)[(long)paVar40];
                    local_12b4 = *(undefined4 *)(local_12d8 + 0x50 + (long)paVar40 * 4);
                    local_12b0 = uVar45;
                    local_12ac = (local_1308.context)->instID[0];
                    local_12a8 = (local_1308.context)->instPrimID[0];
                    local_1318._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_11d8[(long)paVar40];
                    local_136c.m128[0] = -NAN;
                    local_1308.valid = (int *)&local_136c;
                    local_1308.geometryUserPtr = pGVar22->userPtr;
                    local_1308.ray = (RTCRayN *)ray;
                    local_1308.hit = (RTCHitN *)&local_12c8;
                    local_1308.N = 1;
                    if (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00df8962:
                      if (pRVar23->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar23->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar22->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar23->filter)(&local_1308);
                          context = local_1340;
                        }
                        if (*(float *)local_1308.valid == 0.0) goto LAB_00df8a47;
                      }
                      *(float *)((long)local_1308.ray + 0x30) = *(float *)local_1308.hit;
                      *(float *)((long)local_1308.ray + 0x34) = *(float *)(local_1308.hit + 4);
                      *(float *)((long)local_1308.ray + 0x38) = *(float *)(local_1308.hit + 8);
                      *(float *)((long)local_1308.ray + 0x3c) = *(float *)(local_1308.hit + 0xc);
                      *(float *)((long)local_1308.ray + 0x40) = *(float *)(local_1308.hit + 0x10);
                      *(float *)((long)local_1308.ray + 0x44) = *(float *)(local_1308.hit + 0x14);
                      *(float *)((long)local_1308.ray + 0x48) = *(float *)(local_1308.hit + 0x18);
                      *(float *)((long)local_1308.ray + 0x4c) = *(float *)(local_1308.hit + 0x1c);
                      *(float *)((long)local_1308.ray + 0x50) = *(float *)(local_1308.hit + 0x20);
                      paVar35 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1308.ray;
                    }
                    else {
                      local_1328 = in_R8;
                      local_1288 = pSVar37;
                      (*pGVar22->intersectionFilterN)(&local_1308);
                      pSVar37 = local_1288;
                      in_R8 = local_1328;
                      context = local_1340;
                      if (*(float *)local_1308.valid != 0.0) goto LAB_00df8962;
LAB_00df8a47:
                      (ray->super_RayK<1>).tfar = (float)local_1318._0_4_;
                      paVar35 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1308.valid;
                    }
                    uVar45 = (uint)paVar35;
                    *(undefined4 *)(local_1338 + (long)paVar40 * 4) = 0;
                    fVar113 = (ray->super_RayK<1>).tfar;
                    local_1338._0_4_ = -(uint)(local_1358 <= fVar113) & local_1338._0_4_;
                    local_1338._4_4_ = -(uint)(fStack_1354 <= fVar113) & local_1338._4_4_;
                    local_1338._8_4_ = -(uint)(fStack_1350 <= fVar113) & local_1338._8_4_;
                    local_1338._12_4_ = -(uint)(fStack_134c <= fVar113) & local_1338._12_4_;
                  }
                  iVar33 = movmskps(uVar45,local_1338);
                  if (iVar33 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = local_1340;
                  paVar40 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1308.valid;
                } while( true );
              }
            }
            local_10d0 = local_10d0 + 1;
          } while (local_10d0 != local_10f8);
        }
        fVar113 = (ray->super_RayK<1>).tfar;
        auVar116._4_4_ = fVar113;
        auVar116._0_4_ = fVar113;
        auVar116._8_4_ = fVar113;
        auVar116._12_4_ = fVar113;
        uVar36 = local_1110;
        uVar43 = local_1118;
        auVar73 = local_1048;
        fVar113 = local_1098;
        fVar121 = fStack_1094;
        fVar127 = fStack_1090;
        fVar147 = fStack_108c;
        fVar58 = local_10a8;
        fVar65 = fStack_10a4;
        fVar66 = fStack_10a0;
        fVar67 = fStack_109c;
        fVar88 = local_1188;
        fVar98 = fStack_1184;
        fVar100 = fStack_1180;
        fVar101 = fStack_117c;
        fVar108 = local_10b8;
        fVar89 = fStack_10b4;
        fVar99 = fStack_10b0;
        fVar102 = fStack_10ac;
        fVar105 = local_10c8;
        fVar106 = fStack_10c4;
        fVar107 = fStack_10c0;
        fVar111 = fStack_10bc;
        fVar112 = local_1058;
        fVar114 = fStack_1054;
        fVar119 = fStack_1050;
        fVar120 = fStack_104c;
        fVar122 = local_1068;
        fVar125 = fStack_1064;
        fVar126 = fStack_1060;
        fVar128 = fStack_105c;
        fVar131 = local_1078;
        fVar132 = fStack_1074;
        fVar133 = fStack_1070;
        fVar134 = fStack_106c;
        fVar135 = local_1088;
        fVar136 = fStack_1084;
        fVar137 = fStack_1080;
        fVar138 = fStack_107c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }